

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxshift.hpp
# Opt level: O2

void __thiscall soplex::SPxSolverBase<double>::perturbMinLeave(SPxSolverBase<double> *this)

{
  VectorBase<double> *pVVar1;
  UpdateVector<double> *pUVar2;
  VectorBase<double> *pVVar3;
  double dVar4;
  double dVar5;
  
  (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x6d])();
  SSVectorBase<double>::setup(&this->thePvec->thedelta);
  SSVectorBase<double>::setup(&this->theCoPvec->thedelta);
  pVVar1 = this->theLbound;
  pUVar2 = this->thePvec;
  pVVar3 = this->theUbound;
  dVar4 = epsilon(this);
  dVar5 = leavetol(this);
  dVar4 = perturbMin(this,pUVar2,pVVar1,pVVar3,dVar4,dVar5,
                     ((this->super_SPxBasisBase<double>).thedesc.stat)->data,0,1);
  this->theShift = dVar4 + this->theShift;
  pVVar1 = this->theCoLbound;
  pUVar2 = this->theCoPvec;
  pVVar3 = this->theCoUbound;
  dVar4 = epsilon(this);
  dVar5 = leavetol(this);
  dVar4 = perturbMin(this,pUVar2,pVVar1,pVVar3,dVar4,dVar5,
                     ((this->super_SPxBasisBase<double>).thedesc.costat)->data,0,1);
  this->theShift = dVar4 + this->theShift;
  (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x6d])(this);
  return;
}

Assistant:

void SPxSolverBase<R>::perturbMinLeave(void)
{
   SPxOut::debug(this, "DSHIFT05 iteration= {} perturbing {}", this->iteration(), shift());
   pVec().delta().setup();
   coPvec().delta().setup();
   theShift += perturbMin(pVec(), lpBound(), upBound(), epsilon(), leavetol(),
                          this->desc().status(), 0, 1);
   theShift += perturbMin(coPvec(), lcBound(), ucBound(), epsilon(), leavetol(),
                          this->desc().coStatus(), 0, 1);
   SPxOut::debug(this, "\t->{}\n", shift());
}